

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

UBool uhash_compareIChars_63(UHashTok key1,UHashTok key2)

{
  char cVar1;
  char cVar2;
  char *p2;
  char *p1;
  long lVar3;
  bool bVar4;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    bVar4 = false;
  }
  else {
    for (lVar3 = 0; *(char *)((long)key1.pointer + lVar3) != '\0'; lVar3 = lVar3 + 1) {
      cVar1 = uprv_asciitolower_63(*(char *)((long)key1.pointer + lVar3));
      cVar2 = uprv_asciitolower_63(*(char *)((long)key2.pointer + lVar3));
      if (cVar1 != cVar2) {
        cVar1 = *(char *)((long)key1.pointer + lVar3);
        goto LAB_00190176;
      }
    }
    cVar1 = '\0';
LAB_00190176:
    bVar4 = cVar1 == *(char *)((long)key2.pointer + lVar3);
  }
  return bVar4;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareIChars(const UHashTok key1, const UHashTok key2) {
    const char *p1 = (const char*) key1.pointer;
    const char *p2 = (const char*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && uprv_tolower(*p1) == uprv_tolower(*p2)) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}